

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O2

int mbedtls_ssl_get_ciphersuite_id(char *ciphersuite_name)

{
  int iVar1;
  mbedtls_ssl_ciphersuite_t *pmVar2;
  
  pmVar2 = mbedtls_ssl_ciphersuite_from_string(ciphersuite_name);
  if (pmVar2 == (mbedtls_ssl_ciphersuite_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = pmVar2->id;
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_get_ciphersuite_id( const char *ciphersuite_name )
{
    const mbedtls_ssl_ciphersuite_t *cur;

    cur = mbedtls_ssl_ciphersuite_from_string( ciphersuite_name );

    if( cur == NULL )
        return( 0 );

    return( cur->id );
}